

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

void __thiscall
cmGraphVizWriter::cmGraphVizWriter
          (cmGraphVizWriter *this,string *fileName,cmGlobalGenerator *globalGenerator)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  string local_50;
  
  p_Var1 = &(this->super_cmLinkItemGraphVisitor).VisitedItems._M_t._M_impl.super__Rb_tree_header;
  (this->super_cmLinkItemGraphVisitor).VisitedItems._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_cmLinkItemGraphVisitor).VisitedItems._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_cmLinkItemGraphVisitor).VisitedItems._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_cmLinkItemGraphVisitor).VisitedItems._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_cmLinkItemGraphVisitor).VisitedItems._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  p_Var1 = &(this->super_cmLinkItemGraphVisitor).VisitedLinks._M_t._M_impl.super__Rb_tree_header;
  (this->super_cmLinkItemGraphVisitor).VisitedLinks._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->super_cmLinkItemGraphVisitor).VisitedLinks._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_cmLinkItemGraphVisitor).VisitedLinks._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->super_cmLinkItemGraphVisitor).VisitedLinks._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->super_cmLinkItemGraphVisitor).VisitedLinks._M_t._M_impl.super__Rb_tree_header._M_node_count
       = 0;
  (this->super_cmLinkItemGraphVisitor)._vptr_cmLinkItemGraphVisitor =
       (_func_int **)&PTR__cmGraphVizWriter_008bbc20;
  (this->FileName)._M_dataplus._M_p = (pointer)&(this->FileName).field_2;
  pcVar2 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->FileName,pcVar2,pcVar2 + fileName->_M_string_length);
  cmGeneratedFileStream::cmGeneratedFileStream(&this->GlobalFileStream,fileName,false,None);
  p_Var1 = &(this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header;
  (this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PerTargetConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->TargetDependersConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_PROJECT_NAME","");
  cmGlobalGenerator::GetSafeGlobalSetting(&this->GraphName,globalGenerator,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->GraphHeader)._M_dataplus._M_p = (pointer)&(this->GraphHeader).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->GraphHeader,"node [\n  fontsize = \"12\"\n];","");
  (this->GraphNodePrefix)._M_dataplus._M_p = (pointer)&(this->GraphNodePrefix).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->GraphNodePrefix,"node","");
  (this->TargetsToIgnoreRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TargetsToIgnoreRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TargetsToIgnoreRegex).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->GlobalGenerator = globalGenerator;
  this->NextNodeId = 0;
  p_Var1 = &(this->NodeNames)._M_t._M_impl.super__Rb_tree_header;
  (this->NodeNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->NodeNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->NodeNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->NodeNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->NodeNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->GenerateForModuleLibs = true;
  this->GenerateForInterfaceLibs = true;
  this->GenerateForObjectLibs = true;
  this->GenerateForUnknownLibs = true;
  this->GenerateForCustomTargets = false;
  this->GenerateForExternals = true;
  this->GeneratePerTarget = true;
  this->GenerateDependers = true;
  this->GenerateForExecutables = true;
  this->GenerateForStaticLibs = true;
  this->GenerateForSharedLibs = true;
  this->GenerateForModuleLibs = true;
  return;
}

Assistant:

cmGraphVizWriter::cmGraphVizWriter(std::string const& fileName,
                                   const cmGlobalGenerator* globalGenerator)
  : FileName(fileName)
  , GlobalFileStream(fileName)
  , GraphName(globalGenerator->GetSafeGlobalSetting("CMAKE_PROJECT_NAME"))
  , GraphHeader("node [\n  fontsize = \"12\"\n];")
  , GraphNodePrefix("node")
  , GlobalGenerator(globalGenerator)
{
}